

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.h
# Opt level: O0

void assert_dbl_near(double exp,double real,double tol,char *caller,int line)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double local_48;
  double absdiff;
  double diff;
  int line_local;
  char *caller_local;
  double tol_local;
  double real_local;
  double exp_local;
  
  if (NAN(exp)) {
    if (!NAN(real)) {
      unit_error("%s:%d expected NAN, got %0.3e",real,caller,(ulong)(uint)line);
    }
  }
  else if (NAN(real)) {
    unit_error("%s:%d expected %0.3e, got NAN",exp,caller,(ulong)(uint)line);
  }
  iVar2 = 1;
  if ((long)exp < 0) {
    iVar2 = -1;
  }
  iVar1 = 0;
  if (ABS(exp) == INFINITY) {
    iVar1 = iVar2;
  }
  if (iVar1 == 0) {
    iVar2 = 1;
    if ((long)real < 0) {
      iVar2 = -1;
    }
    iVar1 = 0;
    if (ABS(real) == INFINITY) {
      iVar1 = iVar2;
    }
    if (iVar1 != 0) {
      unit_error("%s:%d expected %0.3e, got INFINITY",exp,caller,(ulong)(uint)line);
    }
  }
  else {
    iVar2 = 1;
    if ((long)real < 0) {
      iVar2 = -1;
    }
    iVar1 = 0;
    if (ABS(real) == INFINITY) {
      iVar1 = iVar2;
    }
    if (iVar1 == 0) {
      unit_error("%s:%d expected INFINITY, got %0.3e",real,caller,(ulong)(uint)line);
    }
  }
  dVar3 = exp - real;
  local_48 = dVar3;
  if (dVar3 < 0.0) {
    local_48 = -dVar3;
  }
  if (tol + 2.220446049250313e-16 < local_48) {
    unit_error("%s:%d expected %0.3e, got %0.3e (diff %0.3e, tol %0.3e)",exp,SUB84(real,0),
               SUB84(dVar3,0),tol + 2.220446049250313e-16,caller,(ulong)(uint)line);
  }
  return;
}

Assistant:

inline static void assert_dbl_near(double exp, double real, double tol, char const *caller, int line)
{
  if (isnan(exp))
  {
    if (!isnan(real))
    {
      unit_error("%s:%d expected NAN, got %0.3e", caller, line, real);
    }
  }
  else if (isnan(real))
  {
    unit_error("%s:%d expected %0.3e, got NAN", caller, line, exp);
  }
  if (isinf(exp))
  {
    if (!isinf(real))
    {
      unit_error("%s:%d expected INFINITY, got %0.3e", caller, line, real);
    }
  }
  else if (isinf(real))
  {
    unit_error("%s:%d expected %0.3e, got INFINITY", caller, line, exp);
  }
  double diff = exp - real;
  tol += DBL_EPSILON;
  double absdiff = (diff < 0.) ? -diff : diff;
  if (absdiff > tol)
  {
    unit_error("%s:%d expected %0.3e, got %0.3e (diff %0.3e, tol %0.3e)", caller, line, exp, real, diff, tol);
  }
}